

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * soul::simplifyWhitespace(string *__return_storage_ptr__,string *s)

{
  string_view firstReplacement;
  bool bVar1;
  string_view firstToReplace;
  string_view firstToReplace_00;
  string_view sVar2;
  char *pcVar3;
  char *pcVar4;
  char (*in_stack_fffffffffffffea8) [2];
  string *this;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  string local_108 [32];
  string local_e8;
  string_view local_c8;
  string_view local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98 [2];
  string local_78;
  string local_58;
  string local_38;
  string *local_18;
  string *s_local;
  
  local_18 = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_78,(string *)s);
  choc::text::trim(&local_58,&local_78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98,"\t");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8," ");
  pcVar4 = " ";
  pcVar3 = "\r";
  sVar2._M_str = " ";
  sVar2._M_len = (size_t)"\r";
  firstToReplace._M_str = (char *)local_a8._M_len;
  firstToReplace._M_len = (size_t)local_98[0]._M_str;
  choc::text::
  replace<std::__cxx11::string,char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2]>
            (&local_38,(text *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98[0]._M_len
             ,firstToReplace,sVar2,(char (*) [2])local_a8._M_str,(char (*) [2])0x4ad305,
             (char (*) [2])0x4d441c,in_stack_fffffffffffffea8);
  std::__cxx11::string::operator=((string *)s,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  while( true ) {
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)s);
    local_b8 = sVar2;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"  ");
    bVar1 = choc::text::contains(local_b8,local_c8);
    if (!bVar1) break;
    this = local_108;
    std::__cxx11::string::string(this,(string *)s);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"  ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128," ");
    firstReplacement._M_str = pcVar4;
    firstReplacement._M_len = (size_t)pcVar3;
    firstToReplace_00._M_str = (char *)local_128._M_len;
    firstToReplace_00._M_len = (size_t)local_118._M_str;
    choc::text::replace<std::__cxx11::string>
              (&local_e8,(text *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._M_len
               ,firstToReplace_00,firstReplacement);
    std::__cxx11::string::operator=((string *)s,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string(local_108);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string simplifyWhitespace (std::string s)
{
    s = choc::text::replace (choc::text::trim (s), "\t", " ", "\r", " ", "\n", " ");

    while (choc::text::contains (s, "  "))
        s = choc::text::replace (s, "  ", " ");

    return s;
}